

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O1

int mcu8str_contains(mcu8str *str,char needle)

{
  ulong uVar1;
  
  if ((ulong)str->size != 0) {
    uVar1 = 0;
    do {
      if (str->c_str[uVar1] == needle) {
        return 1;
      }
      uVar1 = uVar1 + 1;
    } while (str->size != uVar1);
  }
  return 0;
}

Assistant:

int mcu8str_contains( const mcu8str* str, char needle )
  {
    const char * it = str->c_str;
    const char * itE = it + str->size;
    for ( ; it!=itE; ++it )
      if ( *it == needle )
        return 1;
    return 0;
  }